

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O2

void test320x320(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  HaarWavelet w2;
  HaarWavelet wavelet;
  Mat dst1;
  Mat m;
  _InputArray local_b8;
  _InputArray local_a0;
  Mat dst;
  
  cv::Mat::Mat(&m,0x140,0x140,0x10);
  cv::Mat::Mat(&dst);
  w2.super_Wavelet._vptr_Wavelet._0_4_ = 0x3010000;
  w2.pImpl = (HaarWavelet *)&m;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&dst1);
  _dst1 = (_func_int **)0x0;
  local_a0.flags = -0x3efdfffa;
  local_a0.sz.width = 1;
  local_a0.sz.height = 4;
  local_a0.obj = &dst1;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&wavelet);
  wavelet.super_Wavelet._vptr_Wavelet = (_func_int **)0x406fe00000000000;
  wavelet.pImpl = (HaarWavelet *)0x406fe00000000000;
  local_b8.flags = -0x3efdfffa;
  local_b8.sz.width = 1;
  local_b8.sz.height = 4;
  local_b8.obj = &wavelet;
  cv::randu((_InputOutputArray *)&w2,&local_a0,&local_b8);
  imagestego::HaarWavelet::HaarWavelet(&wavelet);
  lVar1 = std::chrono::_V2::system_clock::now();
  imagestego::HaarWavelet::transform((HaarWavelet *)&dst1,(Mat *)&wavelet);
  cv::Mat::operator=(&dst,&dst1);
  cv::Mat::~Mat(&dst1);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar3 = std::operator<<(poVar3," ns");
  std::operator<<(poVar3,'\n');
  imagestego::experimental::HaarWavelet::HaarWavelet(&w2);
  lVar4 = std::chrono::_V2::system_clock::now();
  imagestego::experimental::HaarWavelet::transform((HaarWavelet *)&dst1,(Mat *)&w2);
  lVar5 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar3 = std::operator<<(poVar3," ns");
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"Total speedup is: ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / (double)(lVar5 - lVar4));
  std::endl<char,std::char_traits<char>>(poVar3);
  cv::Mat::~Mat(&dst1);
  imagestego::experimental::HaarWavelet::~HaarWavelet(&w2);
  imagestego::HaarWavelet::~HaarWavelet(&wavelet);
  cv::Mat::~Mat(&dst);
  cv::Mat::~Mat(&m);
  return;
}

Assistant:

void test320x320() {
    cv::Mat m(320, 320, CV_8UC3), dst;
    cv::randu(m, cv::Scalar(0, 0, 0), cv::Scalar(255, 255, 255));
    imagestego::HaarWavelet wavelet;
    // start
    auto start = chrono::high_resolution_clock::now();
    dst = wavelet.transform(m);
    auto end = chrono::high_resolution_clock::now();
    // end
    chrono::nanoseconds ns = end - start;
    std::cout << ns.count() << " ns" << '\n';

    imagestego::experimental::HaarWavelet w2;

    start = chrono::high_resolution_clock::now();
    cv::Mat dst1 = w2.transform(m);
    end = chrono::high_resolution_clock::now();
    chrono::nanoseconds ns1 = end - start;
    std::cout << ns1.count() << " ns" << '\n';

    std::cout << "Total speedup is: " << double(ns.count()) / ns1.count() << std::endl;
}